

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

bool icu_63::number::impl::GeneratorHelpers::perUnit
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  bool bVar1;
  UErrorCode *extraout_RDX;
  MeasureUnit *unit;
  ConstChar16Ptr local_30;
  char16_t *local_28;
  
  unit = &macros->perUnit;
  bVar1 = utils::unitIsNoUnit(unit);
  if (bVar1) {
    bVar1 = utils::unitIsPercent(unit);
    if ((!bVar1) && (bVar1 = utils::unitIsPermille(unit), !bVar1)) {
      return false;
    }
  }
  else {
    bVar1 = utils::unitIsCurrency(unit);
    if (!bVar1) {
      local_30.p_ = L"per-measure-unit/";
      UnicodeString::append(sb,&local_30,-1);
      local_28 = local_30.p_;
      blueprint_helpers::generateMeasureUnitOption(unit,sb,extraout_RDX);
      return true;
    }
  }
  *status = U_UNSUPPORTED_ERROR;
  return false;
}

Assistant:

bool GeneratorHelpers::perUnit(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    // Per-units are currently expected to be only MeasureUnits.
    if (utils::unitIsNoUnit(macros.perUnit)) {
        if (utils::unitIsPercent(macros.perUnit) || utils::unitIsPermille(macros.perUnit)) {
            status = U_UNSUPPORTED_ERROR;
            return false;
        } else {
            // Default value: ok to ignore
            return false;
        }
    } else if (utils::unitIsCurrency(macros.perUnit)) {
        status = U_UNSUPPORTED_ERROR;
        return false;
    } else {
        sb.append(u"per-measure-unit/", -1);
        blueprint_helpers::generateMeasureUnitOption(macros.perUnit, sb, status);
        return true;
    }
}